

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_reporter.h
# Opt level: O2

void __thiscall
bandit::detail::progress_reporter::context_starting(progress_reporter *this,char *desc)

{
  allocator local_31;
  value_type local_30;
  
  std::__cxx11::string::string((string *)&local_30,desc,&local_31);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->contexts_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

virtual void context_starting(const char* desc) 
    {
      contexts_.push_back(std::string(desc));
    }